

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdialogbuttonbox.cpp
# Opt level: O0

void __thiscall
QDialogButtonBoxPrivate::createStandardButtons
          (QDialogButtonBoxPrivate *this,StandardButtons buttons)

{
  Int IVar1;
  long in_FS_OFFSET;
  LayoutRule in_stack_0000000c;
  QDialogButtonBoxPrivate *in_stack_00000010;
  uint i;
  StandardButton in_stack_00000074;
  QDialogButtonBoxPrivate *in_stack_00000078;
  uint local_1c;
  QFlags local_c [4];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  for (local_1c = 0x400; local_1c < 0x8000001; local_1c = local_1c << 1) {
    IVar1 = ::QFlags::operator_cast_to_unsigned_int(local_c);
    if ((local_1c & IVar1) != 0) {
      createButton(in_stack_00000010,in_stack_00000074,in_stack_0000000c);
    }
  }
  layoutButtons(in_stack_00000078);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QDialogButtonBoxPrivate::createStandardButtons(QDialogButtonBox::StandardButtons buttons)
{
    uint i = QDialogButtonBox::FirstButton;
    while (i <= QDialogButtonBox::LastButton) {
        if (i & buttons)
            createButton(QDialogButtonBox::StandardButton(i), LayoutRule::SkipLayout);
        i = i << 1;
    }
    layoutButtons();
}